

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.hpp
# Opt level: O0

void __thiscall Threading::SpinLock::unlock(SpinLock *this)

{
  bool bVar1;
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  SpinLock *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = is_locked(this);
  if (!bVar1) {
    Diligent::FormatString<char[100]>
              ((string *)local_30,
               (char (*) [100])
               "Attempting to unlock a spin lock that is not locked. This is a strong indication of a flawed logic."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"unlock",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/SpinLock.hpp"
               ,0x50);
    std::__cxx11::string::~string((string *)local_30);
  }
  std::atomic<bool>::store(&this->m_IsLocked,false,memory_order_release);
  return;
}

Assistant:

void unlock() noexcept
    {
        VERIFY(is_locked(), "Attempting to unlock a spin lock that is not locked. This is a strong indication of a flawed logic.");
        m_IsLocked.store(false, std::memory_order_release);
    }